

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDLGraphicsSystemTests.cpp
# Opt level: O3

void __thiscall
solitaire::graphics::
SDLGraphicsSystemWithCreatedWindowTests_throwIfSDLLoadBMPFailedDuringLoadTexture_Test::TestBody
          (SDLGraphicsSystemWithCreatedWindowTests_throwIfSDLLoadBMPFailedDuringLoadTexture_Test
           *this)

{
  VTable **ppVVar1;
  WrapperMock *this_00;
  bool bVar2;
  TypedExpectation<std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *this_01;
  ActionInterface<std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *impl;
  pointer *__ptr;
  _Any_data local_78;
  code *local_68;
  MockSpec<std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_58;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_38;
  
  this_00 = &((this->super_SDLGraphicsSystemWithCreatedWindowTests).super_SDLGraphicsSystemTests.
              sdlMock.rawPointer)->super_WrapperMock;
  testing::
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>::
  Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
           *)&local_38,(string *)(anonymous_namespace)::texturePath_abi_cxx11_);
  SDL::WrapperMock::gmock_loadBMP
            (&local_58,this_00,
             (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              *)&local_38);
  testing::internal::GetWithoutMatchers();
  this_01 = testing::internal::
            MockSpec<std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
            ::InternalExpectedAt
                      (&local_58,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/graphics/SDLGraphicsSystemTests.cpp"
                       ,0xf6,"*sdlMock","loadBMP(texturePath)");
  impl = (ActionInterface<std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *)operator_new(0x10);
  impl->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_0032a100;
  testing::
  Action<std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::Action((Action<std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
            *)&local_78,impl);
  testing::internal::
  TypedExpectation<std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::WillOnce(this_01,(Action<std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)&local_78);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,3);
  }
  testing::internal::
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~MatcherBase((MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)&local_58.matchers_);
  testing::internal::
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~MatcherBase(&local_38);
  ppVVar1 = &local_58.matchers_.
             super__Tuple_impl<0UL,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>
             .
             super__Head_base<0UL,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_false>
             ._M_head_impl.
             super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
             .vtable_;
  local_58.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>
  .
  super__Head_base<0UL,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_false>
  ._M_head_impl.
  super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  .vtable_ = (VTable *)0x0;
  local_58.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>
  .
  super__Head_base<0UL,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_false>
  ._M_head_impl.
  super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  .buffer_.ptr = (void *)0x0;
  local_58.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>
  .
  super__Head_base<0UL,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_false>
  ._M_head_impl.
  super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  .super_MatcherDescriberInterface._vptr_MatcherDescriberInterface = (_func_int **)0x0;
  local_58.function_mocker_ =
       (FunctionMocker<std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
        *)ppVVar1;
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    SDLGraphicsSystem::loadTexture
              ((SDLGraphicsSystem *)&local_78,
               (string *)
               &(this->super_SDLGraphicsSystemWithCreatedWindowTests).super_SDLGraphicsSystemTests.
                system);
  }
  std::__cxx11::string::_M_replace
            ((ulong)&local_58,0,
             (char *)local_58.matchers_.
                     super__Tuple_impl<0UL,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>
                     .
                     super__Head_base<0UL,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_false>
                     ._M_head_impl.
                     super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                     .super_MatcherDescriberInterface._vptr_MatcherDescriberInterface,0x28b134);
  testing::Message::Message((Message *)&local_78);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_38,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/graphics/SDLGraphicsSystemTests.cpp"
             ,0xf7,(char *)local_58.function_mocker_);
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_38,(Message *)&local_78);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_38);
  if ((long *)local_78._M_unused._0_8_ != (long *)0x0) {
    (**(code **)(*local_78._M_unused._M_object + 8))();
  }
  if (local_58.function_mocker_ !=
      (FunctionMocker<std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       *)ppVVar1) {
    operator_delete(local_58.function_mocker_,
                    (ulong)((long)&(local_58.matchers_.
                                    super__Tuple_impl<0UL,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>
                                    .
                                    super__Head_base<0UL,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_false>
                                    ._M_head_impl.
                                    super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                                   .vtable_)->match_and_explain + 1));
  }
  SDLGraphicsSystemTests::expectQuitSystem((SDLGraphicsSystemTests *)this);
  return;
}

Assistant:

TEST_F(SDLGraphicsSystemWithCreatedWindowTests,
       throwIfSDLLoadBMPFailedDuringLoadTexture)
{
    EXPECT_CALL(*sdlMock, loadBMP(texturePath)).WillOnce(ReturnNull());
    EXPECT_THROW(system.loadTexture(texturePath), std::runtime_error);
    expectQuitSystem();
}